

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm-start.h
# Opt level: O3

bool __thiscall WarmStartBrancher::finished(WarmStartBrancher *this)

{
  char *pcVar1;
  lbool lVar2;
  char cVar3;
  bool bVar4;
  uint uVar5;
  Lit *pLVar6;
  int *pt;
  TrailElem local_28;
  
  bVar4 = true;
  if (engine.conflicts <= this->init_conflicts) {
    uVar5 = (this->decs).sz;
    local_28.x = this->pos;
    if (local_28.x < (int)uVar5) {
      pLVar6 = (this->decs).data;
      cVar3 = -sat.assigns.data[(uint)(pLVar6[(uint)local_28.x].x >> 1)];
      if ((pLVar6[(uint)local_28.x].x & 1U) == 0) {
        cVar3 = sat.assigns.data[(uint)(pLVar6[(uint)local_28.x].x >> 1)];
      }
      if (cVar3 == ::l_Undef.value) {
        bVar4 = false;
      }
      else {
        pcVar1 = sat.assigns.data;
        lVar2.value = ::l_Undef.value;
        if (engine.conflicts < this->init_conflicts) {
          local_28.sz = 4;
          local_28.pt = &this->pos;
          vec<TrailElem>::push(&engine.trail,&local_28);
          uVar5 = (this->decs).sz;
          local_28.x = this->pos;
          pLVar6 = (this->decs).data;
          pcVar1 = sat.assigns.data;
          lVar2 = ::l_Undef;
        }
        do {
          local_28.x = local_28.x + 1;
          this->pos = local_28.x;
          bVar4 = (int)uVar5 <= local_28.x;
          if ((int)uVar5 <= local_28.x) {
            return bVar4;
          }
          cVar3 = -pcVar1[(uint)(pLVar6[(uint)local_28.x].x >> 1)];
          if ((pLVar6[(uint)local_28.x].x & 1U) == 0) {
            cVar3 = pcVar1[(uint)(pLVar6[(uint)local_28.x].x >> 1)];
          }
        } while (cVar3 != lVar2.value);
      }
    }
  }
  return bVar4;
}

Assistant:

bool finished() override {
		// Already deactivated
		if (engine.conflicts > init_conflicts) {
			return true;
		}

		if (pos < static_cast<int>(decs.size())) {
			if (sat.value(decs[pos]) == l_Undef) {
				return false;
			}
			if (engine.conflicts < init_conflicts) {
				trailSave(pos);
			}
			for (++pos; pos < static_cast<int>(decs.size()); ++pos) {
				if (sat.value(decs[pos]) == l_Undef) {
					return false;
				}
			}
		}
		return true;
	}